

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_init_multi(mp_int *mp,...)

{
  char in_AL;
  int iVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  mp_int *a;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list clean_args;
  va_list args;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  clean_args[0].overflow_arg_area = &stack0x00000008;
  uVar3 = 8;
  iVar5 = 0;
  a = mp;
  args[0].overflow_arg_area = clean_args[0].overflow_arg_area;
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while( true ) {
    if (a == (mp_int *)0x0) {
      return 0;
    }
    iVar1 = mp_init(a);
    if (iVar1 != 0) break;
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      puVar2 = (undefined8 *)((long)local_e8 + uVar4);
    }
    else {
      puVar2 = (undefined8 *)args[0].overflow_arg_area;
      args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
    }
    a = (mp_int *)*puVar2;
    iVar5 = iVar5 + -1;
  }
  uVar3 = 8;
  for (; iVar5 != 0; iVar5 = iVar5 + 1) {
    mp_clear(mp);
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      puVar2 = (undefined8 *)((long)local_e8 + uVar4);
    }
    else {
      puVar2 = (undefined8 *)clean_args[0].overflow_arg_area;
      clean_args[0].overflow_arg_area = (void *)((long)clean_args[0].overflow_arg_area + 8);
    }
    mp = (mp_int *)*puVar2;
  }
  return -2;
}

Assistant:

int mp_init_multi(mp_int *mp, ...) 
{
    mp_err res = MP_OKAY;      /* Assume ok until proven otherwise */
    int n = 0;                 /* Number of ok inits */
    mp_int* cur_arg = mp;
    va_list args;

    va_start(args, mp);        /* init args to next argument from caller */
    while (cur_arg != NULL) {
        if (mp_init(cur_arg) != MP_OKAY) {
            /* Oops - error! Back-track and mp_clear what we already
               succeeded in init-ing, then return error.
            */
            va_list clean_args;
            
            /* end the current list */
            va_end(args);
            
            /* now start cleaning up */            
            cur_arg = mp;
            va_start(clean_args, mp);
            while (n--) {
                mp_clear(cur_arg);
                cur_arg = va_arg(clean_args, mp_int*);
            }
            va_end(clean_args);
            res = MP_MEM;
            break;
        }
        n++;
        cur_arg = va_arg(args, mp_int*);
    }
    va_end(args);
    return res;                /* Assumed ok, if error flagged above. */
}